

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p_crypto.c
# Opt level: O1

_Bool i2p_dest_verify(i2p_dest *dest,uint8_t *buf,size_t sz,uint8_t *sig)

{
  _Bool _Var1;
  
  if (dest->sigtype == 0) {
    _Var1 = i2p_dsa_verify(dest->sigkey,buf,sz,sig);
    return _Var1;
  }
  if (dest->sigtype == 7) {
    _Var1 = i2p_eddsa_verify(dest->sigkey,buf,sz,sig);
    return _Var1;
  }
  return false;
}

Assistant:

bool i2p_dest_verify(struct i2p_dest * dest, const uint8_t * buf, size_t sz, const uint8_t * sig)
{
  switch(dest->sigtype)
  {
  case EDDSA_KEYTYPE:
    return i2p_eddsa_verify(dest->sigkey, buf, sz, sig);
  case DSA_KEYTYPE:
    return i2p_dsa_verify(dest->sigkey, buf, sz, sig);
  default:
    return false;
  }
}